

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shifts.c
# Opt level: O2

uint32_t arm_shift_special_zero_behavior
                   (arm7tdmi_t *state,status_register_t *cpsr,shift_type_t type,uint32_t data)

{
  uint uVar1;
  uint32_t uVar2;
  
  if (2 < gba_log_verbosity) {
    puts("[DEBUG] ----handling special case, immediate shift amount 0----");
  }
  switch(type) {
  case LSL:
    uVar2 = data;
    break;
  case LSR:
    uVar2 = arm_lsr(cpsr,data,0x20);
    return uVar2;
  case ASR:
    uVar2 = (int)data >> 0x1f;
    if (cpsr != (status_register_t *)0x0) {
      cpsr->raw = cpsr->raw & 0xdfffffff | data >> 2 & 0x20000000;
    }
    break;
  case ROR:
    uVar1 = (state->cpsr).raw;
    if (cpsr != (status_register_t *)0x0) {
      cpsr->raw = cpsr->raw & 0xdfffffff | (data & 1) << 0x1d;
    }
    uVar2 = (data >> 1) + (uVar1 & 0xe0000000) * 4;
    break;
  default:
    fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
            "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/shifts.c",
            0x85);
    fprintf(_stderr,"Unknown shift type: %d (this should never happen)\n\x1b[0;m",(ulong)type);
    exit(1);
  }
  return uVar2;
}

Assistant:

word arm_shift_special_zero_behavior(arm7tdmi_t* state, status_register_t* cpsr, shift_type_t type, word data) {
    logdebug("----handling special case, immediate shift amount 0----")
    switch (type) {
        case LSL:
            return data; // Not affected.
        case LSR:
            // Treat it as LSR#32
            return arm_shift(cpsr, LSR, data, 32);
        case ASR:
            // Treat it as ASR#32
            return arm_shift(cpsr, ASR, data, 32);
        case ROR: {
            word oldc = state->cpsr.C;
            if (cpsr) {
                cpsr->C = data & 1u;
            }
            return (oldc << 31u) | (data >> 1u);
        }
        default:
            logfatal("Unknown shift type: %d (this should never happen)", type)
    }
}